

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,Script *locking_script,DescriptorScriptType script_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *address_prefixes)

{
  allocator local_71;
  CfdException *local_70;
  Address *local_68;
  Script *local_60;
  Script *local_58;
  undefined1 local_50 [32];
  
  this->script_type_ = script_type;
  Script::Script(&this->locking_script_,locking_script);
  this->is_script_ = false;
  local_58 = &this->locking_script_;
  Script::Script(&this->redeem_script_);
  local_60 = &this->redeem_script_;
  core::Address::Address(&this->address_script_);
  local_68 = &this->address_script_;
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_,address_prefixes);
  if (0xfffffffd < script_type - kDescriptorScriptTaproot) {
    return;
  }
  local_50._0_8_ = "cfdcore_descriptor.cpp";
  local_50._8_4_ = 0x1cd;
  local_50._16_8_ = "DescriptorScriptReference";
  logger::warn<>((CfdSourceLocation *)local_50,"If it is not a raw type, key or script is required."
                );
  local_70 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_50,"If it is not a raw type, key or script is required.",&local_71);
  CfdException::CfdException(local_70,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(local_70,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const Script& locking_script, DescriptorScriptType script_type,
    const std::vector<AddressFormatData>& address_prefixes)
    : script_type_(script_type),
      locking_script_(locking_script),
      is_script_(false),
      is_tapbranch_(false),
      addr_prefixes_(address_prefixes) {
  if ((script_type != DescriptorScriptType::kDescriptorScriptRaw) &&
      (script_type != DescriptorScriptType::kDescriptorScriptMiniscript)) {
    warn(
        CFD_LOG_SOURCE, "If it is not a raw type, key or script is required.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "If it is not a raw type, key or script is required.");
  }
}